

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_resolver_test.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::anon_unknown_0::NameResolverTest_SingleFileMessageEdition2023_Test
::~NameResolverTest_SingleFileMessageEdition2023_Test
          (NameResolverTest_SingleFileMessageEdition2023_Test *this)

{
  NameResolverTest_SingleFileMessageEdition2023_Test *this_local;
  
  NameResolverTest::~NameResolverTest(&this->super_NameResolverTest);
  return;
}

Assistant:

TEST_F(NameResolverTest, SingleFileMessageEdition2023) {
  BuildFileAndPopulatePool("foo.proto",
                           R"schema(
      edition = "2023";

      package proto2_unittest;

      message FooMessage {}
                )schema");

  auto message_descriptor =
      pool_.FindMessageTypeByName("proto2_unittest.FooMessage");
  ClassNameResolver resolver;

  EXPECT_EQ(resolver.GetClassName(message_descriptor, /* immutable = */ true),
            PACKAGE_PREFIX "proto2_unittest.Foo.FooMessage");
  EXPECT_EQ(resolver.GetJavaImmutableClassName(message_descriptor),
            PACKAGE_PREFIX "proto2_unittest.Foo$FooMessage");
}